

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O0

void duckdb::ExecuteStructMakeDate<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  type count;
  type result_00;
  type c;
  Vector *in_RDX;
  DataChunk *in_RDI;
  Vector *dd;
  Vector *mm;
  Vector *yyyy;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *children;
  value_type *vec;
  _func_date_t_long_long_long *in_stack_ffffffffffffff98;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *in_stack_ffffffffffffffa0;
  type a;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffa0,
                      (size_type)in_stack_ffffffffffffff98);
  duckdb::StructVector::GetEntries(pvVar1);
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
  operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  count = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     in_stack_ffffffffffffffa0);
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
  operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                         in_stack_ffffffffffffffa0);
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
  operator[](in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  c = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_ffffffffffffffa0);
  a = c;
  DataChunk::size(in_RDI);
  TernaryExecutor::Execute<long,long,long,duckdb::date_t,duckdb::date_t(*)(long,long,long)>
            (a,in_RDX,c,result_00,(idx_t)count,in_stack_ffffffffffffff98);
  return;
}

Assistant:

static void ExecuteStructMakeDate(DataChunk &input, ExpressionState &state, Vector &result) {
	// this should be guaranteed by the binder
	D_ASSERT(input.ColumnCount() == 1);
	auto &vec = input.data[0];

	auto &children = StructVector::GetEntries(vec);
	D_ASSERT(children.size() == 3);
	auto &yyyy = *children[0];
	auto &mm = *children[1];
	auto &dd = *children[2];

	TernaryExecutor::Execute<T, T, T, date_t>(yyyy, mm, dd, result, input.size(), FromDateCast<T>);
}